

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::Type_Conversions::boxed_type_down_conversion<chaiscript::File_Position_const*>
          (Type_Conversions *this,Conversion_Saves *t_saves,Boxed_Value *to)

{
  undefined8 *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Boxed_Value BVar2;
  undefined1 local_50 [16];
  pointer_____offset_0x10___ *local_40;
  pointer_____offset_0x10___ *local_38;
  undefined4 local_30;
  
  local_40 = &File_Position_const*::typeinfo;
  local_38 = &File_Position::typeinfo;
  local_30 = 5;
  get_conversion((Type_Conversions *)local_50,(Type_Info *)t_saves,(Type_Info *)*in_RCX);
  (**(code **)(*(long *)local_50._0_8_ + 8))(this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  _Var1._M_pi = extraout_RDX;
  if (*(char *)&(to->m_data).
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == '\x01') {
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::push_back
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               &(to->m_data).
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(value_type *)this);
    _Var1._M_pi = extraout_RDX_00;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value boxed_type_down_conversion(Conversion_Saves &t_saves, const Boxed_Value &to) const
        {
          try {
            Boxed_Value ret = get_conversion(to.get_type_info(), user_type<From>())->convert_down(to);
            if (t_saves.enabled) t_saves.saves.push_back(ret);
            return ret;
          } catch (const std::out_of_range &) {
            throw exception::bad_boxed_dynamic_cast(to.get_type_info(), typeid(From), "No known conversion");
          } catch (const std::bad_cast &) {
            throw exception::bad_boxed_dynamic_cast(to.get_type_info(), typeid(From), "Unable to perform dynamic_cast operation");
          }
        }